

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_seckey_tweak_mul(secp256k1_context *ctx,uchar *seckey,uchar *tweak32)

{
  uint uVar1;
  uint uVar2;
  secp256k1_scalar *in_RDX;
  long in_RSI;
  long in_RDI;
  int overflow;
  int ret;
  secp256k1_scalar sec;
  secp256k1_scalar factor;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar3;
  undefined4 uVar4;
  uchar *in_stack_ffffffffffffffd8;
  uint local_4;
  
  uVar4 = 0;
  iVar3 = 0;
  if (in_RDI == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/secp256k1.c"
            ,0x2cd,"test condition failed: ctx != NULL");
    abort();
  }
  if (in_RSI == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)0x0,
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    local_4 = 0;
  }
  else if (in_RDX == (secp256k1_scalar *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)0x0,
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    local_4 = 0;
  }
  else {
    secp256k1_scalar_set_b32(in_RDX,in_stack_ffffffffffffffd8,(int *)0x0);
    local_4 = secp256k1_scalar_set_b32_seckey
                        ((secp256k1_scalar *)CONCAT44(uVar4,iVar3),
                         (uchar *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    uVar1 = (uint)((iVar3 != 0 ^ 0xffU) & 1);
    uVar2 = secp256k1_eckey_privkey_tweak_mul
                      ((secp256k1_scalar *)CONCAT44(local_4,iVar3),
                       (secp256k1_scalar *)
                       (ulong)((CONCAT14(iVar3 != 0,in_stack_ffffffffffffffc8) ^ 0xff00000000) &
                              0x1ffffffff));
    local_4 = uVar1 & uVar2 & local_4;
    secp256k1_scalar_cmov((secp256k1_scalar *)seckey,(secp256k1_scalar *)tweak32,factor);
    secp256k1_scalar_get_b32
              ((uchar *)CONCAT44(local_4,iVar3),
               (secp256k1_scalar *)CONCAT44(uVar1,in_stack_ffffffffffffffc8));
    secp256k1_scalar_clear((secp256k1_scalar *)0x104b03);
    secp256k1_scalar_clear((secp256k1_scalar *)0x104b0d);
  }
  return local_4;
}

Assistant:

int secp256k1_ec_seckey_tweak_mul(const secp256k1_context* ctx, unsigned char *seckey, const unsigned char *tweak32) {
    secp256k1_scalar factor;
    secp256k1_scalar sec;
    int ret = 0;
    int overflow = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);
    ARG_CHECK(tweak32 != NULL);

    secp256k1_scalar_set_b32(&factor, tweak32, &overflow);
    ret = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    ret &= (!overflow) & secp256k1_eckey_privkey_tweak_mul(&sec, &factor);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_get_b32(seckey, &sec);

    secp256k1_scalar_clear(&sec);
    secp256k1_scalar_clear(&factor);
    return ret;
}